

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fade.c
# Opt level: O1

int fade_segment_mix(mixed_segment *segment)

{
  undefined8 *puVar1;
  mixed_buffer *buffer;
  mixed_buffer *buffer_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  code *pcVar5;
  ulong uVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint32_t samples;
  float *out;
  float *in;
  double local_70;
  uint32_t local_64;
  double local_60;
  float local_58;
  float local_54;
  float *local_50;
  float *local_48;
  double local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  puVar1 = (undefined8 *)segment->data;
  local_54 = *(float *)(puVar1 + 2);
  uVar4 = *(int *)((long)puVar1 + 0x1c) - 2;
  if (uVar4 < 3) {
    pcVar5 = (code *)(&PTR_fade_cubic_in_002ba850)[uVar4];
  }
  else {
    pcVar5 = fade_linear;
  }
  local_70 = (double)*(float *)((long)puVar1 + 0x24);
  local_60 = (double)CONCAT44(local_60._4_4_,*(undefined4 *)(puVar1 + 3));
  local_58 = *(float *)((long)puVar1 + 0x14) - local_54;
  local_40 = (double)(1.0 / (float)*(uint *)(puVar1 + 4));
  local_64 = 0xffffffff;
  buffer = (mixed_buffer *)*puVar1;
  buffer_00 = (mixed_buffer *)puVar1[1];
  mixed_buffer_request_read(&local_48,&local_64,buffer);
  if (buffer == buffer_00) {
    local_50 = local_48;
    if (local_64 != 0) {
      local_60 = (double)local_60._0_4_;
      uVar6 = 0;
      local_38 = 0x3ff0000000000000;
      uStack_30 = 0x3ff0000000000000;
      do {
        auVar15._8_8_ = 0;
        auVar15._0_8_ = local_60;
        auVar10._0_8_ = local_70 / local_60;
        auVar10._8_8_ = 0;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = local_70;
        auVar13 = vcmpsd_avx(auVar13,auVar15,1);
        auVar3._8_8_ = uStack_30;
        auVar3._0_8_ = local_38;
        auVar13 = vblendvpd_avx(auVar3,auVar10,auVar13);
        auVar11._0_4_ = (float)auVar13._0_8_;
        auVar11._4_12_ = auVar13._4_12_;
        fVar7 = (float)(*pcVar5)(auVar11._0_8_);
        local_50[uVar6] = (fVar7 * local_58 + local_54) * local_48[uVar6];
        local_70 = local_70 + local_40;
        uVar6 = uVar6 + 1;
      } while (uVar6 < local_64);
    }
  }
  else {
    mixed_buffer_request_write(&local_50,&local_64,buffer_00);
    if (local_64 != 0) {
      local_60 = (double)local_60._0_4_;
      uVar6 = 0;
      local_38 = 0x3ff0000000000000;
      uStack_30 = 0x3ff0000000000000;
      do {
        auVar14._8_8_ = 0;
        auVar14._0_8_ = local_60;
        auVar8._0_8_ = local_70 / local_60;
        auVar8._8_8_ = 0;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = local_70;
        auVar13 = vcmpsd_avx(auVar12,auVar14,1);
        auVar2._8_8_ = uStack_30;
        auVar2._0_8_ = local_38;
        auVar13 = vblendvpd_avx(auVar2,auVar8,auVar13);
        auVar9._0_4_ = (float)auVar13._0_8_;
        auVar9._4_12_ = auVar13._4_12_;
        fVar7 = (float)(*pcVar5)(auVar9._0_8_);
        local_50[uVar6] = (fVar7 * local_58 + local_54) * local_48[uVar6];
        local_70 = local_70 + local_40;
        uVar6 = uVar6 + 1;
      } while (uVar6 < local_64);
    }
    mixed_buffer_finish_read(local_64,buffer);
    mixed_buffer_finish_write(local_64,buffer_00);
  }
  *(float *)((long)puVar1 + 0x24) = (float)local_70;
  return 1;
}

Assistant:

VECTORIZE int fade_segment_mix(struct mixed_segment *segment){
  struct fade_segment_data *data = (struct fade_segment_data *)segment->data;

  double time = data->time_passed;
  float endtime = data->time;
  float from = data->from;
  float range = data->to - data->from;
  double sampletime = 1.0f/data->samplerate;
  
  float (*ease)(float x);
  switch(data->type){
  case MIXED_LINEAR: ease = fade_linear; break;
  case MIXED_CUBIC_IN: ease = fade_cubic_in; break;
  case MIXED_CUBIC_OUT: ease = fade_cubic_out; break;
  case MIXED_CUBIC_IN_OUT: ease = fade_cubic_in_out; break;
  default: ease = fade_linear; break;
  }
  
  // NOTE: You could probably get away with having the same fade factor
  //       for the entirety of the sample range if the total duration
  //       of the buffer is small enough (~1ms?) as the human ear
  //       wouldn't be able to properly notice it.
  with_mixed_buffer_transfer(i, samples, in, data->in, out, data->out, {
      float x = (time < endtime)? time/endtime : 1.0f;
      float fade = from+ease(x)*range;
      out[i] = in[i]*fade;
      time += sampletime;
    });
  data->time_passed = time;
  return 1;
}